

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double NEST::NESTcalc::GetDiffTran_Liquid
                 (double dfield,bool highFieldModel,double Kelvin,double Bar,double Density,int Z)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  undefined1 local_68 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> BoyleModelDT;
  double nDensity;
  double output;
  int Z_local;
  double Density_local;
  double Bar_local;
  double Kelvin_local;
  bool highFieldModel_local;
  double dfield_local;
  
  if (Z == 0x12) {
    BoyleModelDT.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x44a27daee81742c2;
    dVar2 = pow(dfield / 4.3660521525e+22,0.041322);
    dfield_local = dVar2 * 93.342;
  }
  else {
    if (highFieldModel) {
      GetBoyleModelDT();
      nDensity = interpolateFunction((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                      *)local_68,dfield,true);
      if ((nDensity == 0.0) && (!NAN(nDensity))) {
        poVar1 = std::operator<<((ostream *)&std::cerr,"Looks like your desired drift field, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,dfield);
        std::operator<<(poVar1,
                        ", may be either too low or too high to interpolate a DT. Returning DT=0.\n"
                       );
      }
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 local_68);
    }
    else {
      dVar2 = pow(dfield,0.093452);
      dVar3 = exp(dfield * -8.1651e-05);
      nDensity = dVar2 * 37.368 * dVar3;
    }
    dfield_local = nDensity;
  }
  return dfield_local;
}

Assistant:

double NESTcalc::GetDiffTran_Liquid(
    double dfield, bool highFieldModel, double Kelvin, double Bar, double Density,
    int Z)  // for gas: look for Diff_Tran_Gas above
{
  double output;

  if (Z == 18) {
    // G4S2Light.cc from LUXSim
    double nDensity = NEST_AVO * DENSITY / 40.;  // 1 over cm^3
    return  93.342 * pow(dfield / nDensity, 0.041322);
  }

  // Use the standard NEST parametrization
  if (!highFieldModel) {
    output = 37.368 * pow(dfield, .093452) *
             exp(-8.1651e-5 * dfield);  // arXiv:1609.04467 (EXO-200)
  }
  // Use the Boyle model, which is drastically different at high (>5kV/cm)
  // fields. Note here that the Boyle model is only at one temperature First
  // double in pair is field, second is DT
  else {
    const std::vector<std::pair<double, double> > BoyleModelDT =
        GetBoyleModelDT();
    output = interpolateFunction(BoyleModelDT, dfield, true);
    if (output == 0)
      cerr << "Looks like your desired drift field, " << dfield
           << ", may be either too low or too high to interpolate a DT. "
              "Returning DT=0.\n";
  }
  return output;
}